

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::Descriptor::GetSourceLocation(Descriptor *this,SourceLocation *out_location)

{
  bool bVar1;
  Descriptor *in_RDI;
  vector<int,_std::allocator<int>_> path;
  FileDescriptor *in_stack_00000058;
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc8;
  Descriptor *in_stack_ffffffffffffffd0;
  vector<int,_std::allocator<int>_> local_28;
  
  this_00 = &local_28;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x4be3f7);
  GetLocationPath(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  file(in_RDI);
  bVar1 = FileDescriptor::GetSourceLocation
                    (in_stack_00000058,(vector<int,_std::allocator<int>_> *)this,out_location);
  std::vector<int,_std::allocator<int>_>::~vector(this_00);
  return bVar1;
}

Assistant:

bool Descriptor::GetSourceLocation(SourceLocation* out_location) const {
  std::vector<int> path;
  GetLocationPath(&path);
  return file()->GetSourceLocation(path, out_location);
}